

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::NegativeAPIWorkGroupCount::Run(NegativeAPIWorkGroupCount *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  GLenum GVar3;
  bool *compile_error;
  GLint y;
  GLint z;
  GLint x;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&x,
             "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x * gl_GlobalInvocationID.y * gl_GlobalInvocationID.z] = 0;\n}"
             ,(allocator<char> *)&y);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)&x);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&x);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,100000,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91be,0,&x);
    glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91be,1,&y);
    glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91be,2,&z);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,x + 1,1,1);
    GVar3 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar3 == 0x501) {
      glu::CallLogWrapper::glDispatchCompute(this_00,1,y + 1,1);
      GVar3 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar3 == 0x501) {
        glu::CallLogWrapper::glDispatchCompute(this_00,1,1,z + 1);
        GVar3 = glu::CallLogWrapper::glGetError(this_00);
        if (GVar3 == 0x501) {
          return 0;
        }
      }
    }
    anon_unknown_0::Output
              (
              "INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n<num_groups_y> or <num_groups_z> is greater than the value of\nMAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n"
              );
  }
  return -1;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL
			   "void main() {" NL
			   "  g_output[gl_GlobalInvocationID.x * gl_GlobalInvocationID.y * gl_GlobalInvocationID.z] = 0;" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 100000, NULL, GL_DYNAMIC_DRAW);

		GLint x, y, z;
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_COUNT, 0, &x);
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_COUNT, 1, &y);
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_COUNT, 2, &z);

		glUseProgram(m_program);

		glDispatchCompute(x + 1, 1, 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n"
				   "<num_groups_y> or <num_groups_z> is greater than the value of\n"
				   "MAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n");
			return ERROR;
		}

		glDispatchCompute(1, y + 1, 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n"
				   "<num_groups_y> or <num_groups_z> is greater than the value of\n"
				   "MAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n");
			return ERROR;
		}

		glDispatchCompute(1, 1, z + 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n"
				   "<num_groups_y> or <num_groups_z> is greater than the value of\n"
				   "MAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n");
			return ERROR;
		}

		return NO_ERROR;
	}